

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void cvttps2pi_(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  Int32 IVar2;
  bool bVar3;
  
  if ((pMyDisasm->Reserved_).VEX.state != '\x01') {
    if ((pMyDisasm->Reserved_).PrefRepne == 1) {
      (pMyDisasm->Prefix).RepnePrefix = '\b';
      (pMyDisasm->Instruction).Category = 0x50014;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"cvttsd2si",10);
      (pMyDisasm->Reserved_).MemDecoration = 0x68;
    }
    else {
      if ((pMyDisasm->Reserved_).PrefRepe != 1) {
        if ((pMyDisasm->Prefix).OperandSize == '\x01') {
          (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
          (pMyDisasm->Prefix).OperandSize = '\b';
          (pMyDisasm->Instruction).Category = 0x50014;
          builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"cvttpd2pi",10);
          (pMyDisasm->Reserved_).MemDecoration = 0x6d;
        }
        else {
          (pMyDisasm->Instruction).Category = 0x50014;
          builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"cvttps2pi",10);
          (pMyDisasm->Reserved_).MemDecoration = 0x68;
        }
        (pMyDisasm->Reserved_).Register_ = 4;
        decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
        (pMyDisasm->Reserved_).Register_ = 2;
        goto LAB_00118546;
      }
      (pMyDisasm->Prefix).RepPrefix = '\b';
      (pMyDisasm->Instruction).Category = 0x50014;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"cvttss2si",10);
      (pMyDisasm->Reserved_).MemDecoration = 0x67;
    }
    (pMyDisasm->Reserved_).Register_ = 4;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    (pMyDisasm->Reserved_).Register_ = 0;
    goto LAB_00118546;
  }
  UVar1 = (pMyDisasm->Reserved_).VEX.pp;
  if (UVar1 == '\x02') {
    bVar3 = (pMyDisasm->Reserved_).EVEX.state != '\x01';
    IVar2 = 0x110000;
    if (!bVar3) {
      IVar2 = 0x140000;
    }
    (pMyDisasm->Instruction).Category = IVar2;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vcvttss2si",0xb);
    if (bVar3) {
      if ((pMyDisasm->Reserved_).VEX.vvvv != '\x0f') {
        (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
      }
      if ((pMyDisasm->Reserved_).REX.W_ == '\0') goto LAB_001184ff;
    }
    else {
      if ((pMyDisasm->Reserved_).EVEX.vvvv != '\x0f') {
        (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
      }
      if ((pMyDisasm->Reserved_).EVEX.W == '\0') {
        (pMyDisasm->Reserved_).EVEX.tupletype = '\a';
LAB_001184ff:
        (pMyDisasm->Reserved_).MemDecoration = 0x67;
        goto LAB_0011851c;
      }
      (pMyDisasm->Reserved_).EVEX.tupletype = '\b';
    }
    (pMyDisasm->Reserved_).MemDecoration = 0x67;
  }
  else {
    if ((UVar1 == '\x01') || (UVar1 == '\0')) {
      failDecode(pMyDisasm);
      return;
    }
    bVar3 = (pMyDisasm->Reserved_).EVEX.state != '\x01';
    IVar2 = 0x110000;
    if (!bVar3) {
      IVar2 = 0x140000;
    }
    (pMyDisasm->Instruction).Category = IVar2;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vcvttsd2si",0xb);
    if (bVar3) {
      if ((pMyDisasm->Reserved_).VEX.vvvv != '\x0f') {
        (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
      }
      if ((pMyDisasm->Reserved_).REX.W_ == '\0') goto LAB_00118512;
    }
    else {
      if ((pMyDisasm->Reserved_).EVEX.vvvv != '\x0f') {
        (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
      }
      if ((pMyDisasm->Reserved_).EVEX.W == '\0') {
        (pMyDisasm->Reserved_).EVEX.tupletype = '\a';
LAB_00118512:
        (pMyDisasm->Reserved_).MemDecoration = 0x68;
LAB_0011851c:
        (pMyDisasm->Reserved_).Register_ = 4;
        decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
        (pMyDisasm->Reserved_).Register_ = 0;
        (pMyDisasm->Reserved_).OperandSize = 0x20;
        goto LAB_00118546;
      }
      (pMyDisasm->Reserved_).EVEX.tupletype = '\b';
    }
    (pMyDisasm->Reserved_).MemDecoration = 0x68;
  }
  (pMyDisasm->Reserved_).Register_ = 4;
  decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
  (pMyDisasm->Reserved_).Register_ = 0;
  (pMyDisasm->Reserved_).OperandSize = 0x40;
LAB_00118546:
  decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  return;
}

Assistant:

void __bea_callspec__ cvttps2pi_(PDISASM pMyDisasm)
{

 if (GV.VEX.state == InUsePrefix) {
   if (GV.VEX.pp == 0) {
     failDecode(pMyDisasm);
   }
   else if (GV.VEX.pp == 1) {
     failDecode(pMyDisasm);
   }
   else if (GV.VEX.pp == 2) {
     pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vcvttss2si");
     #endif
     if (
         ((GV.EVEX.state != InUsePrefix) && (GV.VEX.vvvv != 15)) ||
         ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.vvvv != 15))
       ) {
       GV.ERROR_OPCODE = UD_;
     }
     if (
         ((GV.EVEX.state != InUsePrefix) && (GV.REX.W_ == 0)) ||
         ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.W == 0))
       ) {
         if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE1_FIXED__32;
         GV.MemDecoration = Arg2dword;
         GV.Register_ = SSE_REG;
         decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
         GV.Register_ = 0;
         GV.OperandSize = 32;
         decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
         GV.EIP_+= GV.DECALAGE_EIP+2;
     }
     else {
       if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE1_FIXED__64;
       GV.MemDecoration = Arg2dword;
       GV.Register_ = SSE_REG;
       decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
       GV.Register_ = 0;
       GV.OperandSize = 64;
       decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
       GV.EIP_+= GV.DECALAGE_EIP+2;

     }
   }
   else {
    /* EVEX.LIG.F2.0F.W0 2C /r */
    /* VCVTTSD2SI r32, xmm1/m64{sae} */
     pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vcvttsd2si");
     #endif
     if (
         ((GV.EVEX.state != InUsePrefix) && (GV.VEX.vvvv != 15)) ||
         ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.vvvv != 15))
       ) {
       GV.ERROR_OPCODE = UD_;
     }
     if (
         ((GV.EVEX.state != InUsePrefix) && (GV.REX.W_ == 0)) ||
         ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.W == 0))
       ) {
         if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE1_FIXED__32;
         GV.MemDecoration = Arg2qword;
         GV.Register_ = SSE_REG;
         decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
         GV.Register_ = 0;
         GV.OperandSize = 32;
         decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
         GV.EIP_+= GV.DECALAGE_EIP+2;
     }
     else {
       if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE1_FIXED__64;
       GV.MemDecoration = Arg2qword;
       GV.Register_ = SSE_REG;
       decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
       GV.Register_ = 0;
       GV.OperandSize = 64;
       decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
       GV.EIP_+= GV.DECALAGE_EIP+2;
     }
   }
 }
 else {
   /* ========= 0xf2 */
   if (GV.PrefRepne == 1) {
     pMyDisasm->Prefix.RepnePrefix = MandatoryPrefix;
     pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+CONVERSION_INSTRUCTION;
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cvttsd2si");
     #endif
     if (GV.REX.W_ == 1) {
       GV.MemDecoration = Arg2qword;
       GV.Register_ = SSE_REG;
       decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
       GV.Register_ = 0;
       decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
       GV.EIP_+= GV.DECALAGE_EIP+2;
     }
     else {
       GV.MemDecoration = Arg2qword;
       GV.Register_ = SSE_REG;
       decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
       GV.Register_ = 0;
       decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
       GV.EIP_+= GV.DECALAGE_EIP+2;
     }
   }
   /* ========== 0xf3 */
   else if (GV.PrefRepe == 1) {
     pMyDisasm->Prefix.RepPrefix = MandatoryPrefix;
     pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+CONVERSION_INSTRUCTION;
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cvttss2si");
     #endif
     GV.MemDecoration = Arg2dword;
     GV.Register_ = SSE_REG;
     decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
     GV.Register_ = 0;
     decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
     GV.EIP_+= GV.DECALAGE_EIP+2;
   }
   /* ========== 0x66 */
   else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
     GV.OperandSize = GV.OriginalOperandSize;
     pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
     pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+CONVERSION_INSTRUCTION;
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cvttpd2pi");
     #endif
     GV.MemDecoration = Arg2_m128_xmm;
     GV.Register_ = SSE_REG;
     decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
     GV.Register_ = MMX_REG;
     decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);

     GV.EIP_+= GV.DECALAGE_EIP+2;
   }
   else {
     pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+CONVERSION_INSTRUCTION;
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cvttps2pi");
     #endif
     GV.MemDecoration = Arg2qword;
     GV.Register_ = SSE_REG;
     decodeModrm(&pMyDisasm->Operand2, pMyDisasm);

     GV.Register_ = MMX_REG;
     decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);

     GV.EIP_+= GV.DECALAGE_EIP+2;
    }
  }
}